

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O3

uint __thiscall
QTlsPrivate::TlsCryptographOpenSSL::pskClientTlsCallback
          (TlsCryptographOpenSSL *this,char *hint,char *identity,uint max_identity_len,uchar *psk,
          uint max_psk_len)

{
  int iVar1;
  size_t sVar2;
  undefined8 *__src;
  P _a;
  P _a_1;
  long in_FS_OFFSET;
  QSslPreSharedKeyAuthenticator authenticator;
  QArrayData *local_58;
  undefined8 *local_50;
  size_t local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QSslPreSharedKeyAuthenticator::QSslPreSharedKeyAuthenticator
            ((QSslPreSharedKeyAuthenticator *)&local_40);
  if (hint == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar2 = strlen(hint);
    iVar1 = (int)sVar2;
  }
  QTlsBackend::setupClientPskAuth
            ((QSslPreSharedKeyAuthenticator *)&local_40,hint,iVar1,max_identity_len,max_psk_len);
  QSslSocket::preSharedKeyAuthenticationRequired((QSslPreSharedKeyAuthenticator *)this->q);
  QSslPreSharedKeyAuthenticator::preSharedKey();
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,1,0x10);
    }
  }
  if (local_48 == 0) {
    sVar2 = 0;
  }
  else {
    QSslPreSharedKeyAuthenticator::identity();
    iVar1 = QSslPreSharedKeyAuthenticator::maximumIdentityLength();
    sVar2 = (long)iVar1;
    if ((long)local_48 < (long)iVar1) {
      sVar2 = local_48;
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    QSslPreSharedKeyAuthenticator::identity();
    __src = local_50;
    if (local_50 == (undefined8 *)0x0) {
      __src = &QByteArray::_empty;
    }
    memcpy(identity,__src,sVar2);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    identity[sVar2] = '\0';
    QSslPreSharedKeyAuthenticator::preSharedKey();
    iVar1 = QSslPreSharedKeyAuthenticator::maximumPreSharedKeyLength();
    sVar2 = (long)iVar1;
    if ((long)local_48 < (long)iVar1) {
      sVar2 = local_48;
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    QSslPreSharedKeyAuthenticator::preSharedKey();
    if (local_50 == (undefined8 *)0x0) {
      local_50 = &QByteArray::_empty;
    }
    memcpy(psk,local_50,sVar2);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
  }
  QSslPreSharedKeyAuthenticator::~QSslPreSharedKeyAuthenticator
            ((QSslPreSharedKeyAuthenticator *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (uint)sVar2;
  }
  __stack_chk_fail();
}

Assistant:

unsigned TlsCryptographOpenSSL::pskClientTlsCallback(const char *hint, char *identity,
                                                     unsigned max_identity_len,
                                                     unsigned char *psk, unsigned max_psk_len)
{
    Q_ASSERT(q);

    QSslPreSharedKeyAuthenticator authenticator;
    // Fill in some read-only fields (for the user)
    const int hintLength = hint ? int(std::strlen(hint)) : 0;
    QTlsBackend::setupClientPskAuth(&authenticator, hint, hintLength, max_identity_len, max_psk_len);
    // Let the client provide the remaining bits...
    emit q->preSharedKeyAuthenticationRequired(&authenticator);

    // No PSK set? Return now to make the handshake fail
    if (authenticator.preSharedKey().isEmpty())
        return 0;

    // Copy data back into OpenSSL
    const int identityLength = qMin(authenticator.identity().size(), authenticator.maximumIdentityLength());
    std::memcpy(identity, authenticator.identity().constData(), identityLength);
    identity[identityLength] = 0;

    const int pskLength = qMin(authenticator.preSharedKey().size(), authenticator.maximumPreSharedKeyLength());
    std::memcpy(psk, authenticator.preSharedKey().constData(), pskLength);
    return pskLength;
}